

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

ssize_t __thiscall CharConvUCS2::read(CharConvUCS2 *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  sVar1 = (**(code **)(*__buf + 0x10))(__buf,lVar2,(long)((int)__nbytes * 2));
  if ((int)sVar1 == 0) {
    if (1 < (int)__nbytes) {
      lVar4 = lVar2 + (__nbytes & 0xffffffff) * 2;
      uVar3 = (__nbytes & 0xffffffff) + 1;
      do {
        lVar4 = lVar4 + -2;
        sVar1 = (**(code **)(*(long *)this + 0x48))(this,lVar4);
        *(int *)(lVar2 + -8 + uVar3 * 4) = (int)sVar1;
        uVar3 = uVar3 - 1;
      } while (2 < uVar3);
    }
    return sVar1;
  }
  err_throw(0x65);
}

Assistant:

virtual void read(wchar_t *buf, CVmDataSource *src, int cnt)
    {
        /* 
         *   Read the wide characters (two bytes each).  The local wchar_t
         *   type could be bigger than two bytes, but can't be less, so we
         *   can be sure we have enough space for the file read.  
         */
        if (src->read(buf, cnt*2))
            err_throw(VMERR_READ_FILE);

        /* 
         *   Convert each character from little-endian to local byte order.
         *   The local wchar_t type could be bigger than two bytes, so work
         *   from the end of the buffer downwards - this will ensure we won't
         *   overwrite bytes before we translate them. 
         */
        for (int i = cnt - 1 ; i > 0 ; --i)
            buf[i] = file_to_machine((unsigned char *)buf + i*2);
    }